

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<tf::Node_*>::swap
          (SmallVectorImpl<tf::Node_*> *this,SmallVectorImpl<tf::Node_*> *RHS)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  reference __a;
  reference __b;
  size_type sVar4;
  iterator ppNVar5;
  iterator ppNVar6;
  SmallVectorTemplateCommon<tf::Node_*,_void> *this_00;
  long lVar7;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RSI;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RDI;
  size_t EltDiff_1;
  size_t EltDiff;
  size_type i;
  size_t NumShared;
  type *in_stack_ffffffffffffff38;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_ffffffffffffff40;
  Node **in_stack_ffffffffffffff48;
  Node **in_stack_ffffffffffffff50;
  size_type local_20;
  size_type local_18;
  
  if (in_RDI != in_RSI) {
    bVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::isSmall(in_RDI);
    if ((bVar1) || (bVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::isSmall(in_RSI), bVar1)) {
      sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      sVar3 = SmallVectorTemplateCommon<tf::Node_*,_void>::capacity(in_stack_ffffffffffffff40);
      if (sVar3 < sVar2) {
        SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
        SmallVectorTemplateBase<tf::Node_*,_true>::grow
                  ((SmallVectorTemplateBase<tf::Node_*,_true> *)in_stack_ffffffffffffff40,
                   (size_t)in_stack_ffffffffffffff38);
      }
      sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      sVar3 = SmallVectorTemplateCommon<tf::Node_*,_void>::capacity(in_stack_ffffffffffffff40);
      if (sVar3 < sVar2) {
        SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
        SmallVectorTemplateBase<tf::Node_*,_true>::grow
                  ((SmallVectorTemplateBase<tf::Node_*,_true> *)in_stack_ffffffffffffff40,
                   (size_t)in_stack_ffffffffffffff38);
      }
      local_18 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      if (sVar2 < local_18) {
        local_18 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      }
      for (local_20 = 0; local_20 != local_18; local_20 = local_20 + 1) {
        __a = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                        (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        __b = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                        (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        std::swap<tf::Node*>(__a,__b);
      }
      sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      sVar4 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
      if (sVar4 < sVar2) {
        sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
        sVar4 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
        SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
        SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
        SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RSI);
        SmallVectorTemplateBase<tf::Node*,true>::uninitialized_copy<tf::Node*,tf::Node*>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (Node **)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RSI);
        SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RSI,ppNVar5 + (sVar2 - sVar4));
        ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
        ppNVar6 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
        SmallVectorTemplateBase<tf::Node_*,_true>::destroy_range(ppNVar5 + local_18,ppNVar6);
        ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
        SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RDI,ppNVar5 + local_18);
      }
      else {
        sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
        sVar4 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
        if (sVar4 < sVar2) {
          this_00 = (SmallVectorTemplateCommon<tf::Node_*,_void> *)
                    SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffff40);
          sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size(this_00);
          lVar7 = (long)this_00 - sVar2;
          ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RSI);
          ppNVar5 = ppNVar5 + local_18;
          ppNVar6 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RSI);
          SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
          SmallVectorTemplateBase<tf::Node*,true>::uninitialized_copy<tf::Node*,tf::Node*>
                    (ppNVar6,ppNVar5,(Node **)this_00,in_stack_ffffffffffffff38);
          ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
          SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RDI,ppNVar5 + lVar7);
          ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RSI);
          ppNVar6 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RSI);
          SmallVectorTemplateBase<tf::Node_*,_true>::destroy_range(ppNVar5 + local_18,ppNVar6);
          ppNVar5 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RSI);
          SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RSI,ppNVar5 + local_18);
        }
      }
    }
    else {
      std::swap<void*>((void **)in_RDI,(void **)in_RSI);
      std::swap<void*>(&(in_RDI->super_SmallVectorBase).EndX,&(in_RSI->super_SmallVectorBase).EndX);
      std::swap<void*>(&(in_RDI->super_SmallVectorBase).CapacityX,
                       &(in_RSI->super_SmallVectorBase).CapacityX);
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->EndX, RHS.EndX);
    std::swap(this->CapacityX, RHS.CapacityX);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.setEnd(RHS.end()+EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->setEnd(this->begin()+NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->setEnd(this->end() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.setEnd(RHS.begin()+NumShared);
  }
}